

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_scatter_acc(Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv,void *alpha)

{
  long in_RDI;
  long in_R8;
  char err_string_1 [256];
  char err_string [256];
  Integer in_stack_000002c8;
  Integer in_stack_000002d0;
  void *in_stack_000002d8;
  void *in_stack_000002e0;
  Integer in_stack_000002e8;
  int in_stack_000002f4;
  double *in_stack_00000300;
  double *in_stack_00000308;
  void *in_stack_00000310;
  char local_238 [256];
  char local_138 [128];
  Integer in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  
  if (0 < in_R8) {
    if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
      sprintf(local_138,"%s: INVALID ARRAY HANDLE","nga_scatter_acc");
      pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    if (GA[in_RDI + 1000].actv == 0) {
      sprintf(local_238,"%s: ARRAY NOT ACTIVE","nga_scatter_acc");
      pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    GAstat.numsca = GAstat.numsca + 1;
    gai_gatscat_new(in_stack_000002f4,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                    in_stack_000002d0,in_stack_000002c8,in_stack_00000300,in_stack_00000308,
                    in_stack_00000310);
  }
  return;
}

Assistant:

void pnga_scatter_acc(Integer g_a, void* v, void *subscript, Integer c_flag,
                      Integer nv, void *alpha)
{

  if (nv < 1) return;
  ga_check_handleM(g_a, "nga_scatter_acc");
  
  GAstat.numsca++;

#ifdef USE_GATSCAT_NEW
  gai_gatscat_new(SCATTER_ACC, g_a, v, subscript, c_flag, nv, &GAbytes.scatot,
              &GAbytes.scaloc, alpha);
#else
  gai_gatscat(SCATTER_ACC, g_a, v, subscript, nv, &GAbytes.scatot,
              &GAbytes.scaloc, alpha);
#endif

}